

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O1

void boost::detail::function::
     functor_manager<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>_>
     ::manager(long *in_buffer,long *out_buffer,undefined4 op)

{
  ulong __n;
  undefined8 *puVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *__dest;
  long lVar4;
  undefined8 *__src;
  
  switch(op) {
  case 0:
    puVar1 = (undefined8 *)*in_buffer;
    puVar3 = (undefined8 *)operator_new(0x20);
    __n = puVar1[2];
    puVar3[2] = __n;
    *puVar3 = 0;
    __src = puVar1;
    __dest = puVar3;
    if (0x10 < __n) {
      __dest = (undefined8 *)operator_new__(__n);
      *puVar3 = __dest;
      __src = (undefined8 *)*puVar1;
    }
    memcpy(__dest,__src,__n);
    *(undefined4 *)(puVar3 + 3) = *(undefined4 *)(puVar1 + 3);
    *out_buffer = (long)puVar3;
    break;
  case 1:
    *out_buffer = *in_buffer;
    *in_buffer = 0;
    break;
  case 2:
    puVar1 = (undefined8 *)*out_buffer;
    if (puVar1 != (undefined8 *)0x0) {
      if ((0x10 < (ulong)puVar1[2]) && ((void *)*puVar1 != (void *)0x0)) {
        operator_delete__((void *)*puVar1);
      }
      operator_delete(puVar1);
    }
    *out_buffer = 0;
    break;
  case 3:
    iVar2 = strcmp(*(char **)(*out_buffer + 8) + (**(char **)(*out_buffer + 8) == '*'),
                   "N5boost9algorithm6detail13token_finderFINS1_10is_any_ofFIcEEEE");
    if (iVar2 == 0) {
      lVar4 = *in_buffer;
    }
    else {
      lVar4 = 0;
    }
    *out_buffer = lVar4;
    break;
  default:
    *out_buffer = (long)&algorithm::detail::
                         token_finderF<boost::algorithm::detail::is_any_ofF<char>>::typeinfo;
    *(undefined2 *)(out_buffer + 1) = 0;
  }
  return;
}

Assistant:

static inline void
        manager(const function_buffer& in_buffer, function_buffer& out_buffer, 
                functor_manager_operation_type op, mpl::false_)
        {
          if (op == clone_functor_tag) {
            // Clone the functor
            // GCC 2.95.3 gets the CV qualifiers wrong here, so we
            // can't do the static_cast that we should do.
            // jewillco: Changing this to static_cast because GCC 2.95.3 is
            // obsolete.
            const functor_type* f =
              static_cast<const functor_type*>(in_buffer.obj_ptr);
            functor_type* new_f = new functor_type(*f);
            out_buffer.obj_ptr = new_f;
          } else if (op == move_functor_tag) {
            out_buffer.obj_ptr = in_buffer.obj_ptr;
            in_buffer.obj_ptr = 0;
          } else if (op == destroy_functor_tag) {
            /* Cast from the void pointer to the functor pointer type */
            functor_type* f =
              static_cast<functor_type*>(out_buffer.obj_ptr);
            delete f;
            out_buffer.obj_ptr = 0;
          } else if (op == check_functor_type_tag) {
            const detail::sp_typeinfo& check_type
              = *out_buffer.type.type;
            if (BOOST_FUNCTION_COMPARE_TYPE_ID(check_type, BOOST_SP_TYPEID(Functor)))
              out_buffer.obj_ptr = in_buffer.obj_ptr;
            else
              out_buffer.obj_ptr = 0;
          } else /* op == get_functor_type_tag */ {
            out_buffer.type.type = &BOOST_SP_TYPEID(Functor);
            out_buffer.type.const_qualified = false;
            out_buffer.type.volatile_qualified = false;
          }
        }